

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O1

void DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  DiyFp DVar15;
  
  bVar3 = -(char)Mp->e;
  uVar13 = 1L << (bVar3 & 0x3f);
  DVar15 = DiyFp::operator-(Mp,W);
  uVar2 = DVar15.f;
  uVar9 = Mp->f >> (bVar3 & 0x3f);
  uVar12 = 1;
  uVar8 = (uint)uVar9;
  if (((((9 < uVar8) && (uVar12 = 2, 99 < uVar8)) && (uVar12 = 3, 999 < uVar8)) &&
      ((uVar12 = 4, 9999 < uVar8 && (uVar12 = 5, 99999 < uVar8)))) &&
     ((uVar12 = 6, 999999 < uVar8 &&
      ((uVar12 = 7, 9999999 < uVar8 && (uVar12 = 8, 99999999 < uVar8)))))) {
    uVar12 = (ulong)(10 - (uVar8 < 1000000000));
  }
  uVar5 = Mp->f & uVar13 - 1;
  *len = 0;
  do {
    if ((int)uVar12 < 1) {
      uVar8 = 0;
      do {
        uVar9 = delta;
        cVar10 = (char)(uVar5 * 10 >> (bVar3 & 0x3f));
        if ((cVar10 != '\0') || (*len != 0)) {
          iVar6 = *len;
          *len = iVar6 + 1;
          buffer[iVar6] = cVar10 + '0';
        }
        delta = uVar9 * 10;
        uVar5 = uVar5 * 10 & uVar13 - 1;
        uVar8 = uVar8 + 1;
      } while (delta < uVar5 || delta - uVar5 == 0);
      *K = *K - uVar8;
      if (uVar13 <= delta - uVar5) {
        uVar2 = uVar2 * DigitGen::kPow10[uVar8];
        uVar12 = uVar2 - uVar5;
        if (uVar5 <= uVar2 && uVar12 != 0) {
          iVar6 = *len;
          uVar5 = uVar5 + uVar13;
          uVar9 = uVar9 * 10 - uVar5;
          do {
            if ((uVar2 <= uVar5) && (uVar12 <= uVar5 - uVar2)) {
              return;
            }
            buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
            bVar14 = uVar13 <= uVar9;
            uVar9 = uVar9 - uVar13;
            if (uVar2 <= uVar5) {
              return;
            }
            uVar12 = uVar12 - uVar13;
            uVar5 = uVar5 + uVar13;
          } while (bVar14);
        }
        return;
      }
      return;
    }
    uVar11 = (int)uVar12 - 1;
    uVar12 = (ulong)uVar11;
    uVar8 = (uint)uVar9;
    switch(uVar12) {
    case 0:
      uVar9 = 0;
      goto LAB_002a885d;
    case 1:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 10);
      iVar6 = (int)((uVar9 & 0xffffffff) / 10) * 10;
      break;
    case 2:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 100);
      iVar6 = (int)((uVar9 & 0xffffffff) / 100) * 100;
      break;
    case 3:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 1000);
      iVar6 = (int)((uVar9 & 0xffffffff) / 1000) * 1000;
      break;
    case 4:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 10000);
      iVar6 = (int)((uVar9 & 0xffffffff) / 10000) * 10000;
      break;
    case 5:
      uVar9 = uVar9 >> 5 & 0x7ffffff;
      uVar4 = (uint)(uVar9 / 0xc35);
      iVar6 = (int)(uVar9 / 0xc35) * 100000;
      break;
    case 6:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 1000000);
      iVar6 = (int)((uVar9 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 7:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 10000000);
      iVar6 = (int)((uVar9 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 8:
      uVar4 = (uint)((uVar9 & 0xffffffff) / 100000000);
      iVar6 = (int)((uVar9 & 0xffffffff) / 100000000) * 100000000;
      break;
    case 9:
      uVar1 = (uint)((uVar9 >> 9 & 0x7fffff) * 0x44b83 >> 0x20);
      uVar4 = uVar1 >> 7;
      iVar6 = (uVar1 >> 7) * 1000000000;
      break;
    default:
      uVar8 = 0;
      goto LAB_002a885d;
    }
    uVar9 = (ulong)(uVar8 - iVar6);
    uVar8 = uVar4;
LAB_002a885d:
    if ((uVar8 != 0) || (*len != 0)) {
      iVar6 = *len;
      *len = iVar6 + 1;
      buffer[iVar6] = (char)uVar8 + '0';
    }
    uVar7 = ((uVar9 & 0xffffffff) << (bVar3 & 0x3f)) + uVar5;
    if (uVar7 <= delta) {
      *K = *K + uVar11;
      uVar9 = (ulong)DigitGen::kPow10[uVar12] << (bVar3 & 0x3f);
      if (uVar2 <= uVar7) {
        return;
      }
      if (delta - uVar7 < uVar9) {
        return;
      }
      iVar6 = *len;
      uVar12 = uVar2 - uVar7;
      uVar7 = uVar7 + uVar9;
      uVar13 = delta - uVar7;
      do {
        if ((uVar2 <= uVar7) && (uVar12 <= uVar7 - uVar2)) {
          return;
        }
        buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
        bVar14 = uVar9 <= uVar13;
        uVar13 = uVar13 - uVar9;
        if (uVar2 <= uVar7) {
          return;
        }
        uVar12 = uVar12 - uVar9;
        uVar7 = uVar7 + uVar9;
      } while (bVar14);
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
	static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
	const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
	const DiyFp wp_w = Mp - W;
	uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
	uint64_t p2 = Mp.f & (one.f - 1);
	int kappa = static_cast<int>(CountDecimalDigit32(p1));
	*len = 0;

	while (kappa > 0) {
		uint32_t d;
		switch (kappa) {
			case 10: d = p1 / 1000000000; p1 %= 1000000000; break;
			case  9: d = p1 /  100000000; p1 %=  100000000; break;
			case  8: d = p1 /   10000000; p1 %=   10000000; break;
			case  7: d = p1 /    1000000; p1 %=    1000000; break;
			case  6: d = p1 /     100000; p1 %=     100000; break;
			case  5: d = p1 /      10000; p1 %=      10000; break;
			case  4: d = p1 /       1000; p1 %=       1000; break;
			case  3: d = p1 /        100; p1 %=        100; break;
			case  2: d = p1 /         10; p1 %=         10; break;
			case  1: d = p1;              p1 =           0; break;
			default:
#if defined(_MSC_VER)
				__assume(0);
#elif defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 5))
				__builtin_unreachable();
#else
				d = 0;
#endif
		}
		if (d || *len)
			buffer[(*len)++] = '0' + static_cast<char>(d);
		kappa--;
		uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
		if (tmp <= delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
			return;
		}
	}

	// kappa = 0
	for (;;) {
		p2 *= 10;
		delta *= 10;
		char d = static_cast<char>(p2 >> -one.e);
		if (d || *len)
			buffer[(*len)++] = '0' + d;
		p2 &= one.f - 1;
		kappa--;
		if (p2 < delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * kPow10[-kappa]);
			return;
		}
	}
}